

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O0

uint64_t icu_63::util64_pow(uint32_t base,uint16_t exponent)

{
  undefined8 local_28;
  uint64_t pow;
  uint64_t result;
  uint16_t exponent_local;
  uint64_t uStack_10;
  uint32_t base_local;
  
  if (base == 0) {
    uStack_10 = 0;
  }
  else {
    pow = 1;
    local_28 = (ulong)base;
    result._2_2_ = exponent;
    while( true ) {
      if ((result._2_2_ & 1) == 1) {
        pow = local_28 * pow;
      }
      result._2_2_ = (uint16_t)((int)(uint)result._2_2_ >> 1);
      if (result._2_2_ == 0) break;
      local_28 = local_28 * local_28;
    }
    uStack_10 = pow;
  }
  return uStack_10;
}

Assistant:

uint64_t util64_pow(uint32_t base, uint16_t exponent)  {
    if (base == 0) {
        return 0;
    }
    uint64_t result = 1;
    uint64_t pow = base;
    while (true) {
        if ((exponent & 1) == 1) {
            result *= pow;
        }
        exponent >>= 1;
        if (exponent == 0) {
            break;
        }
        pow *= pow;
    }
    return result;
}